

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O2

string_t __thiscall
duckdb::Base64EncodeOperator::Operation<duckdb::string_t,duckdb::string_t>
          (Base64EncodeOperator *this,string_t input,Vector *result)

{
  Vector *vector;
  idx_t len;
  char *pcVar1;
  string_t blob;
  string_t blob_00;
  string_t result_str;
  anon_union_16_2_67f50693_for_value local_28;
  
  blob.value._8_8_ = input.value._0_8_;
  blob.value._0_8_ = this;
  vector = (Vector *)Blob::ToBase64Size(blob);
  local_28.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       StringVector::EmptyString(input.value._8_8_,vector,len);
  pcVar1 = local_28._8_8_;
  if (local_28._0_4_ < 0xd) {
    pcVar1 = local_28.pointer.prefix;
  }
  blob_00.value.pointer.ptr = pcVar1;
  blob_00.value._0_8_ = blob.value._8_8_;
  Blob::ToBase64((Blob *)this,blob_00,local_28.pointer.prefix);
  string_t::Finalize((string_t *)&local_28.pointer);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_28.pointer;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto result_str = StringVector::EmptyString(result, Blob::ToBase64Size(input));
		Blob::ToBase64(input, result_str.GetDataWriteable());
		result_str.Finalize();
		return result_str;
	}